

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uitercollationiterator.cpp
# Opt level: O1

UChar32 __thiscall
icu_63::FCDUIterCollationIterator::previousCodePoint
          (FCDUIterCollationIterator *this,UErrorCode *errorCode)

{
  State SVar1;
  UBool UVar2;
  uint uVar3;
  uint uVar4;
  long in_RAX;
  char cVar5;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  do {
    while (SVar1 = this->state, SVar1 != ITER_IN_FCD_SEGMENT) {
      if (SVar1 != ITER_CHECK_BWD) goto LAB_0021fbb3;
      uVar3 = (*(code *)((this->super_UIterCollationIterator).iter)->previous)();
      if ((int)uVar3 < 0) {
        this->pos = 0;
        this->state = ITER_IN_FCD_SEGMENT;
        this->start = 0;
        return -1;
      }
      if ((int)uVar3 < 0x300) {
        return uVar3;
      }
      if ((ulong)(byte)CollationFCD::lcccIndex[uVar3 >> 5] == 0) {
        return uVar3;
      }
      if ((*(uint *)(CollationFCD::lcccBits + (ulong)(byte)CollationFCD::lcccIndex[uVar3 >> 5] * 4)
           >> (uVar3 & 0x1f) & 1) == 0) {
        return uVar3;
      }
      uVar4 = 0xffffffff;
      if (((uVar3 & 0x1fff01) == 0xf01) ||
         (((uVar4 = (*(code *)((this->super_UIterCollationIterator).iter)->previous)(),
           0xbf < (int)uVar4 && ((ulong)(byte)CollationFCD::tcccIndex[uVar4 >> 5] != 0)) &&
          ((*(uint *)(CollationFCD::tcccBits + (ulong)(byte)CollationFCD::tcccIndex[uVar4 >> 5] * 4)
            >> (uVar4 & 0x1f) & 1) != 0)))) {
        (*(code *)((this->super_UIterCollationIterator).iter)->next)();
        if (-1 < (int)uVar4) {
          (*(code *)((this->super_UIterCollationIterator).iter)->next)();
        }
        UVar2 = previousSegment(this,errorCode);
        uStack_38 = (ulong)(uStack_38._4_4_ | -(uint)(UVar2 == '\0')) << 0x20;
        cVar5 = (UVar2 != '\0') * '\x02' + '\x01';
      }
      else {
        if ((uVar3 & 0x7ffffc00) == 0xdc00) {
          if ((int)uVar4 < 0) {
            uVar4 = (*(code *)((this->super_UIterCollationIterator).iter)->previous)();
          }
          if ((uVar4 & 0xfffffc00) == 0xd800) {
            uStack_38 = (ulong)(uVar3 + uVar4 * 0x400 + 0xfca02400) << 0x20;
            cVar5 = '\x01';
            goto LAB_0021fc70;
          }
        }
        cVar5 = '\0';
        if (-1 < (int)uVar4) {
          (*(code *)((this->super_UIterCollationIterator).iter)->next)();
        }
      }
LAB_0021fc70:
      if (cVar5 != '\x03') {
        if (cVar5 != '\0') {
          uVar3 = uStack_38._4_4_;
        }
        return uVar3;
      }
    }
    if (this->pos != this->start) {
      uVar3 = uiter_previous32_63((this->super_UIterCollationIterator).iter);
      goto LAB_0021fca9;
    }
LAB_0021fbb3:
    if (this->pos != 0 && 2 < (int)SVar1) {
      uVar3 = UnicodeString::char32At(&this->normalized,this->pos + -1);
LAB_0021fca9:
      this->pos = this->pos + (uVar3 < 0x10000 | 0xfffffffe);
      return uVar3;
    }
    switchToBackward(this);
  } while( true );
}

Assistant:

UChar32
FCDUIterCollationIterator::previousCodePoint(UErrorCode &errorCode) {
    UChar32 c;
    for(;;) {
        if(state == ITER_CHECK_BWD) {
            c = iter.previous(&iter);
            if(c < 0) {
                start = pos = 0;
                state = ITER_IN_FCD_SEGMENT;
                return U_SENTINEL;
            }
            if(CollationFCD::hasLccc(c)) {
                UChar32 prev = U_SENTINEL;
                if(CollationFCD::maybeTibetanCompositeVowel(c) ||
                        CollationFCD::hasTccc(prev = iter.previous(&iter))) {
                    iter.next(&iter);
                    if(prev >= 0) {
                        iter.next(&iter);
                    }
                    if(!previousSegment(errorCode)) {
                        return U_SENTINEL;
                    }
                    continue;
                }
                // hasLccc(trail)=true for all trail surrogates
                if(U16_IS_TRAIL(c)) {
                    if(prev < 0) {
                        prev = iter.previous(&iter);
                    }
                    if(U16_IS_LEAD(prev)) {
                        return U16_GET_SUPPLEMENTARY(prev, c);
                    }
                }
                if(prev >= 0) {
                    iter.next(&iter);
                }
            }
            return c;
        } else if(state == ITER_IN_FCD_SEGMENT && pos != start) {
            c = uiter_previous32(&iter);
            pos -= U16_LENGTH(c);
            U_ASSERT(c >= 0);
            return c;
        } else if(state >= IN_NORM_ITER_AT_LIMIT && pos != 0) {
            c = normalized.char32At(pos - 1);
            pos -= U16_LENGTH(c);
            return c;
        } else {
            switchToBackward();
        }
    }
}